

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O1

void __thiscall
slang::ast::FirstMatchAssertionExpr::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (FirstMatchAssertionExpr *this,SequenceMethodExprVisitor *visitor)

{
  size_type sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>(this->seq,visitor);
  sVar1 = (this->matchItems).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->matchItems).data_;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        seq.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }